

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

Vector3<double> * phyr::cross<double>(Vector3<double> *v1,Vector3<double> *v2)

{
  double *in_RDX;
  double *in_RSI;
  Vector3<double> *in_RDI;
  double z2;
  double y2;
  double x2;
  double z1;
  double y1;
  double x1;
  
  Vector3<double>::Vector3
            (in_RDI,in_RSI[1] * in_RDX[2] + -(in_RSI[2] * in_RDX[1]),
             in_RSI[2] * *in_RDX + -(*in_RSI * in_RDX[2]),
             *in_RSI * in_RDX[1] + -(in_RSI[1] * *in_RDX));
  return in_RDI;
}

Assistant:

inline Vector3<T> cross(const Vector3<T>& v1, const Vector3<T>& v2) {
    ASSERT(!v1.hasNaNs() && !v2.hasNaNs());
    double x1 = v1.x, y1 = v1.y, z1 = v1.z;
    double x2 = v2.x, y2 = v2.y, z2 = v2.z;
    return Vector3<T>((y1 * z2 - z1 * y2), (z1 * x2 - x1 * z2), (x1 * y2 - y1 * x2));
}